

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O3

int CfdCreateExtkey(void *handle,int network_type,int key_type,char *parent_key,char *fingerprint,
                   char *key,char *chain_code,uchar depth,uint32_t child_number,char **extkey)

{
  size_type sVar1;
  bool bVar2;
  NetType net_type;
  char *pcVar3;
  CfdException *pCVar4;
  _Alloc_hider _Var5;
  _Alloc_hider _Var6;
  ExtPubkey extpubkey;
  string parent_key_str;
  string fingerprint_str;
  string key_str;
  string chain_code_str;
  bool local_199;
  string local_198;
  string local_178;
  undefined1 local_158 [40];
  pointer local_130;
  pointer local_118;
  pointer local_100;
  pointer local_f8;
  string local_d8;
  void *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_b8 = handle;
  cfd::Initialize();
  if (extkey == (char **)0x0) {
    local_158._0_8_ = "cfdcapi_key.cpp";
    local_158._8_4_ = 0x6ad;
    local_158._16_8_ = "CfdCreateExtkey";
    cfd::core::logger::log<>((CfdSourceLocation *)local_158,kCfdLogLevelWarning,"extkey is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_158,"Failed to parameter. extkey is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_158);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(key);
  if (bVar2) {
    local_158._0_8_ = "cfdcapi_key.cpp";
    local_158._8_4_ = 0x6b3;
    local_158._16_8_ = "CfdCreateExtkey";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_158,kCfdLogLevelWarning,"key is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_158,"Failed to parameter. key is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_158);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_199 = true;
  net_type = cfd::capi::ConvertNetType(network_type,&local_199);
  if (local_199 == false) {
    local_158._0_8_ = "cfdcapi_key.cpp";
    local_158._8_4_ = 0x6bc;
    local_158._16_8_ = "CfdCreateExtkey";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_158,kCfdLogLevelWarning,
               "privkey\'s network_type is invalid.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_158,"Failed to parameter. privkey\'s network_type is invalid.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_158);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::__cxx11::string::string((string *)&local_70,key,(allocator *)local_158);
  std::__cxx11::string::string((string *)&local_50,chain_code,(allocator *)local_158);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  bVar2 = cfd::capi::IsEmptyString(parent_key);
  sVar1 = local_b0._M_string_length;
  if (!bVar2) {
    strlen(parent_key);
    std::__cxx11::string::_M_replace((ulong)&local_b0,0,(char *)sVar1,(ulong)parent_key);
  }
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  bVar2 = cfd::capi::IsEmptyString(fingerprint);
  sVar1 = local_90._M_string_length;
  if (!bVar2) {
    strlen(fingerprint);
    std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)sVar1,(ulong)fingerprint);
  }
  if (key_type == 0) {
    cfd::core::Privkey::Privkey((Privkey *)&local_198);
    if (local_70._M_string_length == 0x40) {
      cfd::core::Privkey::Privkey((Privkey *)local_158,&local_70,kMainnet,true);
    }
    else {
      cfd::core::Privkey::FromWif((Privkey *)local_158,&local_70,net_type,true);
    }
    _Var5._M_p = local_198._M_dataplus._M_p;
    local_198._M_dataplus._M_p = (pointer)local_158._0_8_;
    local_198._M_string_length = local_158._8_8_;
    local_198.field_2._M_allocated_capacity = local_158._16_8_;
    local_158._0_8_ = (pointer)0x0;
    local_158._8_8_ = (pointer)0x0;
    local_158._16_8_ = (pointer)0x0;
    if (_Var5._M_p == (pointer)0x0) {
      local_198.field_2._8_8_ = local_158._24_8_;
    }
    else {
      operator_delete(_Var5._M_p);
      local_198.field_2._8_8_ = local_158._24_8_;
      if ((pointer)local_158._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_158._0_8_);
      }
    }
    if ((char *)local_90._M_string_length == (char *)0x0) {
      cfd::core::Privkey::Privkey((Privkey *)&local_178);
      if ((char *)local_b0._M_string_length == (char *)0x40) {
        cfd::core::Privkey::Privkey((Privkey *)local_158,&local_b0,kMainnet,true);
      }
      else {
        cfd::core::Privkey::FromWif((Privkey *)local_158,&local_b0,net_type,true);
      }
      _Var5._M_p = local_178._M_dataplus._M_p;
      local_178._M_dataplus._M_p = (pointer)local_158._0_8_;
      local_178._M_string_length = local_158._8_8_;
      local_178.field_2._M_allocated_capacity = local_158._16_8_;
      local_158._0_8_ = (pointer)0x0;
      local_158._8_8_ = (pointer)0x0;
      local_158._16_8_ = (pointer)0x0;
      if (_Var5._M_p == (pointer)0x0) {
        local_178.field_2._8_8_ = local_158._24_8_;
      }
      else {
        operator_delete(_Var5._M_p);
        local_178.field_2._8_8_ = local_158._24_8_;
        if ((pointer)local_158._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_158._0_8_);
        }
      }
      cfd::core::ByteData256::ByteData256((ByteData256 *)&local_d8,&local_50);
      cfd::core::ExtPrivkey::ExtPrivkey
                ((ExtPrivkey *)local_158,net_type,(Privkey *)&local_178,(Privkey *)&local_198,
                 (ByteData256 *)&local_d8,depth,child_number);
      if (local_d8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      cfd::core::ExtPrivkey::ToString_abi_cxx11_(&local_d8,(ExtPrivkey *)local_158);
      pcVar3 = cfd::capi::CreateString(&local_d8);
      *extkey = pcVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if (local_f8 != (pointer)0x0) {
        operator_delete(local_f8);
      }
      if (local_118 != (pointer)0x0) {
        operator_delete(local_118);
      }
      if (local_130 != (pointer)0x0) {
        operator_delete(local_130);
      }
      _Var5._M_p = local_178._M_dataplus._M_p;
      if ((pointer)local_158._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_158._0_8_);
        _Var5._M_p = local_178._M_dataplus._M_p;
      }
    }
    else {
      cfd::core::ByteData::ByteData((ByteData *)&local_178,&local_90);
      cfd::core::ByteData256::ByteData256((ByteData256 *)&local_d8,&local_50);
      cfd::core::ExtPrivkey::ExtPrivkey
                ((ExtPrivkey *)local_158,net_type,(ByteData *)&local_178,(Privkey *)&local_198,
                 (ByteData256 *)&local_d8,depth,child_number);
      if (local_d8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if (local_178._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      cfd::core::ExtPrivkey::ToString_abi_cxx11_(&local_178,(ExtPrivkey *)local_158);
      pcVar3 = cfd::capi::CreateString(&local_178);
      *extkey = pcVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      if (local_f8 != (pointer)0x0) {
        operator_delete(local_f8);
      }
      if (local_118 != (pointer)0x0) {
        operator_delete(local_118);
      }
      _Var5._M_p = (pointer)local_158._0_8_;
      if (local_130 != (pointer)0x0) {
        operator_delete(local_130);
        _Var5._M_p = (pointer)local_158._0_8_;
      }
    }
    _Var6._M_p = local_198._M_dataplus._M_p;
    if ((pointer)_Var5._M_p != (pointer)0x0) {
      operator_delete(_Var5._M_p);
      _Var6._M_p = local_198._M_dataplus._M_p;
    }
  }
  else {
    if ((char *)local_90._M_string_length == (char *)0x0) {
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_198,&local_b0);
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_178,&local_70);
      cfd::core::ByteData256::ByteData256((ByteData256 *)&local_d8,&local_50);
      cfd::core::ExtPubkey::ExtPubkey
                ((ExtPubkey *)local_158,net_type,(Pubkey *)&local_198,(Pubkey *)&local_178,
                 (ByteData256 *)&local_d8,depth,child_number);
      if (local_d8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if (local_178._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      if (local_198._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      cfd::core::ExtPubkey::ToString_abi_cxx11_(&local_198,(ExtPubkey *)local_158);
      pcVar3 = cfd::capi::CreateString(&local_198);
    }
    else {
      cfd::core::ByteData::ByteData((ByteData *)&local_198,&local_90);
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_178,&local_70);
      cfd::core::ByteData256::ByteData256((ByteData256 *)&local_d8,&local_50);
      cfd::core::ExtPubkey::ExtPubkey
                ((ExtPubkey *)local_158,net_type,(ByteData *)&local_198,(Pubkey *)&local_178,
                 (ByteData256 *)&local_d8,depth,child_number);
      if (local_d8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if (local_178._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      if (local_198._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      cfd::core::ExtPubkey::ToString_abi_cxx11_(&local_198,(ExtPubkey *)local_158);
      pcVar3 = cfd::capi::CreateString(&local_198);
    }
    *extkey = pcVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if (local_100 != (pointer)0x0) {
      operator_delete(local_100);
    }
    if (local_118 != (pointer)0x0) {
      operator_delete(local_118);
    }
    _Var6._M_p = (pointer)local_158._0_8_;
    if (local_130 != (pointer)0x0) {
      operator_delete(local_130);
      _Var6._M_p = (pointer)local_158._0_8_;
    }
  }
  if ((pointer)_Var6._M_p != (pointer)0x0) {
    operator_delete(_Var6._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

CFDC_API int CfdCreateExtkey(
    void* handle, int network_type, int key_type, const char* parent_key,
    const char* fingerprint, const char* key, const char* chain_code,
    unsigned char depth, uint32_t child_number, char** extkey) {
  try {
    cfd::Initialize();
    if (extkey == nullptr) {
      warn(CFD_LOG_SOURCE, "extkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. extkey is null.");
    }
    if (IsEmptyString(key)) {
      warn(CFD_LOG_SOURCE, "key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. key is null or empty.");
    }

    bool is_bitcoin = true;
    cfd::core::NetType net_type = ConvertNetType(network_type, &is_bitcoin);
    if (!is_bitcoin) {
      warn(CFD_LOG_SOURCE, "privkey's network_type is invalid.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey's network_type is invalid.");
    }
    std::string key_str = key;
    std::string chain_code_str = chain_code;
    std::string parent_key_str;
    if (!IsEmptyString(parent_key)) {
      parent_key_str = parent_key;
    }
    std::string fingerprint_str;
    if (!IsEmptyString(fingerprint)) {
      fingerprint_str = fingerprint;
    }

    if (key_type == ExtKeyType::kExtPrivkey) {
      Privkey privkey;
      if (key_str.size() == (Privkey::kPrivkeySize * 2)) {
        privkey = Privkey(key_str);
      } else {
        privkey = Privkey::FromWif(key_str, net_type);
      }
      if (fingerprint_str.empty()) {
        Privkey parent_privkey;
        if (parent_key_str.size() == (Privkey::kPrivkeySize * 2)) {
          parent_privkey = Privkey(parent_key_str);
        } else {
          parent_privkey = Privkey::FromWif(parent_key_str, net_type);
        }
        ExtPrivkey extprivkey(
            net_type, parent_privkey, privkey, ByteData256(chain_code_str),
            depth, child_number);
        *extkey = CreateString(extprivkey.ToString());
      } else {
        ExtPrivkey extprivkey(
            net_type, ByteData(fingerprint_str), privkey,
            ByteData256(chain_code_str), depth, child_number);
        *extkey = CreateString(extprivkey.ToString());
      }
    } else {
      if (fingerprint_str.empty()) {
        ExtPubkey extpubkey(
            net_type, Pubkey(parent_key_str), Pubkey(key_str),
            ByteData256(chain_code_str), depth, child_number);
        *extkey = CreateString(extpubkey.ToString());
      } else {
        ExtPubkey extpubkey(
            net_type, ByteData(fingerprint_str), Pubkey(key_str),
            ByteData256(chain_code_str), depth, child_number);
        *extkey = CreateString(extpubkey.ToString());
      }
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}